

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-copy.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  BigAttr *pBVar2;
  char **ppcVar3;
  size_t *fsize;
  ptrdiff_t *block;
  long lVar4;
  ulong uVar5;
  size_t asStack_398 [9];
  undefined8 uStack_350;
  undefined1 auStack_348 [16];
  BigArray array;
  BigBlockPtr ptrnew;
  BigBlock bbnew;
  BigBlock bb;
  ulong local_60;
  size_t nattr;
  size_t buffersize;
  BigFile bf;
  BigFile bfnew;
  
  buffersize = 0;
  bf.basename = (char *)0x0;
  bbnew.dirty = 0;
  bbnew._76_4_ = 0;
  bbnew.Nfile = 0;
  bbnew._60_4_ = 0;
  bbnew.attrset = (BigAttrSet *)0x0;
  bbnew.foffset = (size_t *)0x0;
  bbnew.fchecksum = (uint *)0x0;
  bbnew.size = 0;
  bbnew.fsize = (size_t *)0x0;
  bbnew.nmemb = 0;
  bbnew._12_4_ = 0;
  bbnew.basename = (char *)0x0;
  ptrnew.aoffset = 0;
  bbnew.dtype[0] = '\0';
  bbnew.dtype[1] = '\0';
  bbnew.dtype[2] = '\0';
  bbnew.dtype[3] = '\0';
  bbnew.dtype[4] = '\0';
  bbnew.dtype[5] = '\0';
  bbnew.dtype[6] = '\0';
  bbnew.dtype[7] = '\0';
  nattr = 0x10000000;
  bfnew.basename = (char *)0x0;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          uStack_350 = 0x1026c5;
          iVar1 = getopt(argc,argv,"n:vB:f:");
          if (iVar1 != 0x42) break;
          uStack_350 = 0x1026dc;
          __isoc99_sscanf(_optarg,"%td",&nattr);
        }
        if (0x6d < iVar1) break;
        if (iVar1 == -1) {
          lVar4 = (long)_optind;
          if (argc - _optind != 3) goto LAB_001029d3;
          uStack_350 = 0x102744;
          iVar1 = big_file_open((BigFile *)&buffersize,argv[lVar4]);
          if (iVar1 != 0) goto LAB_001029d8;
          if (bfnew.basename == (char *)0x0) {
            bfnew.basename = argv[lVar4];
          }
          uStack_350 = 0x102762;
          iVar1 = big_file_create(&bf,bfnew.basename);
          if (iVar1 != 0) goto LAB_001029dd;
          uStack_350 = 0x10277f;
          iVar1 = big_file_open_block((BigFile *)&buffersize,(BigBlock *)&bbnew.dirty,
                                      argv[lVar4 + 1]);
          if (iVar1 != 0) goto LAB_001029e2;
          fsize = asStack_398;
          iVar1 = big_file_create_block
                            (&bf,(BigBlock *)&ptrnew.aoffset,argv[lVar4 + 2],(char *)&bbnew.dirty,0,
                             0,fsize);
          if (iVar1 != 0) goto LAB_001029e7;
          if (bbnew.basename == (char *)0x0) {
            pBVar2 = big_block_list_attrs((BigBlock *)&bbnew.dirty,&local_60);
            if (local_60 != 0) {
              ppcVar3 = &pBVar2->data;
              uVar5 = 0;
              do {
                big_block_set_attr((BigBlock *)&ptrnew.aoffset,ppcVar3[-1],*ppcVar3,
                                   (char *)((long)ppcVar3 + -0x14),
                                   ((BigAttr *)(ppcVar3 + -3))->nmemb);
                uVar5 = uVar5 + 1;
                ppcVar3 = ppcVar3 + 4;
              } while (uVar5 < local_60);
            }
            block = &ptrnew.aoffset;
            iVar1 = big_block_close((BigBlock *)block);
            if (iVar1 == 0) {
              big_block_close((BigBlock *)&bbnew.dirty);
              big_file_close((BigFile *)&buffersize);
              big_file_close(&bf);
              return 0;
            }
            main_cold_10();
            CHUNK_BYTES = (size_t)block;
            return 0;
          }
          goto LAB_001029ec;
        }
        if (iVar1 != 0x66) goto LAB_001029bf;
        bfnew.basename = _optarg;
      }
      if (iVar1 != 0x6e) break;
      uStack_350 = 0x10271b;
      atoi(_optarg);
    }
  } while (iVar1 == 0x76);
LAB_001029bf:
  uStack_350 = 0x1029c4;
  main_cold_11();
  uStack_350 = 0x1029c9;
  main_cold_8();
  uStack_350 = 0x1029ce;
  main_cold_7();
  uStack_350 = 0x1029d3;
  main_cold_6();
LAB_001029d3:
  uStack_350 = 0x1029d8;
  main_cold_1();
LAB_001029d8:
  uStack_350 = 0x1029dd;
  main_cold_2();
LAB_001029dd:
  uStack_350 = 0x1029e2;
  main_cold_3();
LAB_001029e2:
  fsize = (size_t *)auStack_348;
  uStack_350 = 0x1029e7;
  main_cold_4();
LAB_001029e7:
  fsize[-1] = 0x1029ec;
  main_cold_5();
LAB_001029ec:
  fsize[-1] = 0x1029f1;
  abort();
}

Assistant:

int main(int argc, char * argv[]) {
    BigFile bf = {0};
    BigFile bfnew = {0};
    BigBlock bb = {0};
    BigBlock bbnew = {0};
    int verbose = 0;
    int ch;
    int Nfile = -1;
    size_t buffersize = 256 * 1024 * 1024;
    char * newfile = NULL;
    while(-1 != (ch = getopt(argc, argv, "n:vB:f:"))) {
        switch(ch) {
            case 'f':
                newfile = optarg;
                break;
            case 'n':
                Nfile = atoi(optarg);
                break;
            case 'B':
                sscanf(optarg, "%td", &buffersize);
                break;
            case 'v':
                verbose = 1;
                break;
            default:
                usage();
        }
    }
    if(argc - optind + 1 != 4) {
        usage();
    }
    argv += optind - 1;
    if(0 != big_file_open(&bf, argv[1])) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    if(newfile == NULL) {
        newfile = argv[1];
    }
    if(0 != big_file_create(&bfnew, newfile)) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    
    if(0 != big_file_open_block(&bf, &bb, argv[2])) {
        fprintf(stderr, "failed to open: %s\n", big_file_get_error_message());
        exit(1);
    }
    if(Nfile == -1 || bb.Nfile == 0) {
        Nfile = bb.Nfile;
    }
    /* avoid Nfile == 0 */
    size_t newsize[Nfile + 10];
    int i;
    for(i = 0; i < Nfile; i ++) {
        newsize[i] = (i + 1) * bb.size / Nfile
            - i * bb.size / Nfile;
    }

    if(0 != big_file_create_block(&bfnew, &bbnew, argv[3], bb.dtype, bb.nmemb, Nfile, newsize)) {
        fprintf(stderr, "failed to create temp: %s\n", big_file_get_error_message());
        exit(1);
    }

    if(bbnew.size != bb.size) {
        abort();
    }

    /* copy attrs */
    size_t nattr;
    BigAttr * attrs = big_block_list_attrs(&bb, &nattr);
    for(i = 0; i < nattr; i ++) {
        BigAttr * attr = &attrs[i];
        big_block_set_attr(&bbnew, attr->name, attr->data, attr->dtype, attr->nmemb);
    }
    
    if(bb.nmemb > 0 && bb.size > 0) {
        /* copy data */
        size_t chunksize = buffersize / (bb.nmemb * dtype_itemsize(bb.dtype));
        BigBlockPtr ptrnew;
        ptrdiff_t offset;
        BigArray array;

        for(offset = 0; offset < bb.size; ) {
            if(0 != big_block_read_simple(&bb, offset, chunksize, &array, NULL)) {
                fprintf(stderr, "failed to read original: %s\n", big_file_get_error_message());
                exit(1);
            }
            if(0 != big_block_seek(&bbnew, &ptrnew, offset)) {
                fprintf(stderr, "failed to seek new: %s\n", big_file_get_error_message());
                exit(1);
            }

            if(0 != big_block_write(&bbnew, &ptrnew, &array)) {
                fprintf(stderr, "failed to write new: %s\n", big_file_get_error_message());
                exit(1);
            }

            free(array.data);
            offset += array.dims[0];
            if(verbose) {
                fprintf(stderr, "%td / %td done (%0.4g%%)\r", offset, bb.size, (100. / bb.size) * offset);
            }
        }
    }
    if(0 != big_block_close(&bbnew)) {
        fprintf(stderr, "failed to close new: %s\n", big_file_get_error_message());
        exit(1);
    }
    big_block_close(&bb);
    big_file_close(&bf);
    big_file_close(&bfnew);
    return 0;
}